

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O3

void get_msurf_descriptor_haar_unroll_3_1_False(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  float *pfVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  float *data;
  ulong uVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  int k_count;
  float *pfVar31;
  float *pfVar32;
  float *pfVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  int iVar37;
  int iVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  int iVar44;
  long lVar45;
  int scale;
  int iVar46;
  float *pfVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  undefined1 auVar78 [12];
  undefined1 in_ZMM8 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  undefined1 auVar82 [64];
  int data_width;
  int local_d0;
  long local_c8;
  
  auVar56._8_4_ = 0x3effffff;
  auVar56._0_8_ = 0x3effffff3effffff;
  auVar56._12_4_ = 0x3effffff;
  auVar55._8_4_ = 0x80000000;
  auVar55._0_8_ = 0x8000000080000000;
  auVar55._12_4_ = 0x80000000;
  fVar62 = ipoint->scale;
  auVar82 = ZEXT464((uint)fVar62);
  auVar48 = vpternlogd_avx512vl(auVar56,ZEXT416((uint)fVar62),auVar55,0xf8);
  auVar48 = ZEXT416((uint)(fVar62 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  fVar61 = -0.08 / (fVar62 * fVar62);
  scale = (int)auVar48._0_4_;
  auVar49._0_4_ = (int)auVar48._0_4_;
  auVar49._4_4_ = (int)auVar48._4_4_;
  auVar49._8_4_ = (int)auVar48._8_4_;
  auVar49._12_4_ = (int)auVar48._12_4_;
  auVar48 = vcvtdq2ps_avx(auVar49);
  auVar49 = vpternlogd_avx512vl(auVar56,ZEXT416((uint)ipoint->x),auVar55,0xf8);
  auVar49 = ZEXT416((uint)(ipoint->x + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50._0_8_ = (double)auVar49._0_4_;
  auVar50._8_8_ = auVar49._8_8_;
  auVar54._0_8_ = (double)fVar62;
  auVar54._8_8_ = 0;
  auVar49 = vfmadd231sd_fma(auVar50,auVar54,ZEXT816(0x3fe0000000000000));
  auVar53._0_4_ = (float)auVar49._0_8_;
  auVar53._4_12_ = auVar49._4_12_;
  auVar49 = vpternlogd_avx512vl(auVar56,ZEXT416((uint)ipoint->y),auVar55,0xf8);
  fVar81 = auVar53._0_4_ - auVar48._0_4_;
  auVar49 = ZEXT416((uint)(ipoint->y + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar51._0_8_ = (double)auVar49._0_4_;
  auVar51._8_8_ = auVar49._8_8_;
  auVar49 = vfmadd231sd_fma(auVar51,auVar54,ZEXT816(0x3fe0000000000000));
  auVar52._0_4_ = (float)auVar49._0_8_;
  auVar52._4_12_ = auVar49._4_12_;
  fVar4 = auVar52._0_4_ - auVar48._0_4_;
  auVar48 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar62),auVar53);
  auVar49 = vpternlogd_avx512vl(auVar56,auVar48,auVar55,0xf8);
  auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar49._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = ZEXT416((uint)fVar62);
  if (scale < (int)auVar48._0_4_) {
    auVar57._8_4_ = 0x3effffff;
    auVar57._0_8_ = 0x3effffff3effffff;
    auVar57._12_4_ = 0x3effffff;
    auVar58._8_4_ = 0x80000000;
    auVar58._0_8_ = 0x8000000080000000;
    auVar58._12_4_ = 0x80000000;
    auVar48 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar49,auVar52);
    auVar50 = vpternlogd_avx512vl(auVar58,auVar48,auVar57,0xea);
    auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar50._0_4_));
    auVar48 = vroundss_avx(auVar48,auVar48,0xb);
    if (scale < (int)auVar48._0_4_) {
      auVar48 = vfmadd231ss_fma(auVar53,auVar49,ZEXT416(0x41300000));
      auVar59._8_4_ = 0x80000000;
      auVar59._0_8_ = 0x8000000080000000;
      auVar59._12_4_ = 0x80000000;
      auVar50 = vpternlogd_avx512vl(auVar59,auVar48,auVar57,0xea);
      auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar50._0_4_));
      auVar48 = vroundss_avx(auVar48,auVar48,0xb);
      if ((int)auVar48._0_4_ + scale <= iimage->width) {
        auVar48 = vfmadd231ss_fma(auVar52,auVar49,ZEXT416(0x41300000));
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar50 = vpternlogd_avx512vl(auVar57,auVar48,auVar14,0xf8);
        auVar48 = ZEXT416((uint)(auVar48._0_4_ + auVar50._0_4_));
        auVar48 = vroundss_avx(auVar48,auVar48,0xb);
        if ((int)auVar48._0_4_ + scale <= iimage->height) {
          iVar1 = iimage->data_width;
          pfVar32 = iimage->data;
          iVar21 = scale * 2;
          fVar4 = fVar4 + 0.5;
          pfVar47 = haarResponseX;
          pfVar31 = haarResponseY;
          iVar16 = -0xc;
          do {
            auVar48._0_4_ = (float)iVar16;
            auVar78 = in_ZMM8._4_12_;
            auVar48._4_12_ = auVar78;
            lVar42 = 0;
            auVar76._0_4_ = (float)(iVar16 + 1);
            auVar76._4_12_ = auVar78;
            auVar75._0_4_ = (float)(iVar16 + 2);
            auVar75._4_12_ = auVar78;
            auVar48 = vfmadd213ss_fma(auVar48,auVar49,ZEXT416((uint)fVar4));
            auVar50 = vfmadd213ss_fma(auVar76,auVar49,ZEXT416((uint)fVar4));
            auVar51 = vfmadd213ss_fma(auVar75,auVar49,ZEXT416((uint)fVar4));
            iVar22 = (int)auVar48._0_4_;
            iVar28 = (int)auVar50._0_4_;
            iVar44 = (int)auVar51._0_4_;
            iVar24 = (iVar22 + -1) * iVar1;
            iVar17 = (iVar22 + -1 + scale) * iVar1;
            iVar27 = (iVar22 + -1 + iVar21) * iVar1;
            iVar37 = (iVar44 + -1 + iVar21) * iVar1;
            iVar46 = (iVar28 + -1) * iVar1;
            iVar22 = (iVar28 + -1 + scale) * iVar1;
            iVar28 = (iVar28 + -1 + iVar21) * iVar1;
            iVar41 = (iVar44 + -1) * iVar1;
            iVar44 = (iVar44 + -1 + scale) * iVar1;
            do {
              auVar73._0_4_ = (float)((int)lVar42 + -0xc);
              auVar73._4_12_ = auVar56._4_12_;
              auVar48 = vfmadd213ss_fma(auVar73,auVar49,ZEXT416((uint)(fVar81 + 0.5)));
              iVar38 = (int)auVar48._0_4_;
              iVar40 = iVar38 + -1 + scale;
              iVar30 = iVar38 + -1 + iVar21;
              fVar62 = pfVar32[iVar27 + -1 + iVar38];
              fVar65 = pfVar32[iVar24 + iVar30];
              auVar51 = SUB6416(ZEXT464(0x40000000),0);
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar32[iVar24 + iVar40] -
                                                      pfVar32[iVar27 + iVar40])),auVar51,
                                        ZEXT416((uint)(pfVar32[iVar27 + iVar30] -
                                                      pfVar32[iVar24 + -1 + iVar38])));
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar32[iVar17 + -1 + iVar38] -
                                                      pfVar32[iVar17 + iVar30])),auVar51,
                                        ZEXT416((uint)(pfVar32[iVar27 + iVar30] -
                                                      pfVar32[iVar24 + -1 + iVar38])));
              pfVar47[lVar42] = (fVar62 - fVar65) + auVar48._0_4_;
              pfVar31[lVar42] = auVar50._0_4_ - (fVar62 - fVar65);
              fVar62 = pfVar32[iVar28 + -1 + iVar38];
              fVar65 = pfVar32[iVar46 + iVar30];
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar32[iVar46 + iVar40] -
                                                      pfVar32[iVar28 + iVar40])),auVar51,
                                        ZEXT416((uint)(pfVar32[iVar28 + iVar30] -
                                                      pfVar32[iVar46 + -1 + iVar38])));
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar32[iVar22 + -1 + iVar38] -
                                                      pfVar32[iVar22 + iVar30])),auVar51,
                                        ZEXT416((uint)(pfVar32[iVar28 + iVar30] -
                                                      pfVar32[iVar46 + -1 + iVar38])));
              pfVar47[lVar42 + 0x18] = (fVar62 - fVar65) + auVar48._0_4_;
              pfVar31[lVar42 + 0x18] = auVar50._0_4_ - (fVar62 - fVar65);
              fVar62 = pfVar32[iVar37 + -1 + iVar38];
              fVar65 = pfVar32[iVar41 + iVar30];
              auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar32[iVar41 + iVar40] -
                                                      pfVar32[iVar40 + iVar37])),auVar51,
                                        ZEXT416((uint)(pfVar32[iVar30 + iVar37] -
                                                      pfVar32[iVar41 + -1 + iVar38])));
              auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar32[iVar44 + -1 + iVar38] -
                                                      pfVar32[iVar44 + iVar30])),auVar51,
                                        ZEXT416((uint)(pfVar32[iVar30 + iVar37] -
                                                      pfVar32[iVar41 + -1 + iVar38])));
              pfVar47[lVar42 + 0x30] = (fVar62 - fVar65) + auVar48._0_4_;
              pfVar31[lVar42 + 0x30] = auVar50._0_4_ - (fVar62 - fVar65);
              lVar42 = lVar42 + 1;
            } while (lVar42 != 0x18);
            pfVar31 = pfVar31 + 0x48;
            pfVar47 = pfVar47 + 0x48;
            bVar3 = iVar16 < 9;
            iVar16 = iVar16 + 3;
          } while (bVar3);
          goto LAB_001d883c;
        }
      }
    }
  }
  iVar1 = scale * 2;
  local_c8 = 0;
  iVar21 = -0xc;
  do {
    auVar63._0_4_ = (float)iVar21;
    auVar78 = in_ZMM8._4_12_;
    auVar63._4_12_ = auVar78;
    iVar44 = -0xc;
    auVar66._0_4_ = (float)(iVar21 + 1);
    auVar66._4_12_ = auVar78;
    auVar51 = auVar82._0_16_;
    auVar48 = vfmadd213ss_fma(auVar63,auVar51,ZEXT416((uint)fVar4));
    auVar50 = vfmadd213ss_fma(auVar66,auVar51,ZEXT416((uint)fVar4));
    fVar62 = auVar48._0_4_;
    auVar70._0_4_ = (float)(iVar21 + 2);
    auVar70._4_12_ = auVar78;
    auVar48 = vfmadd213ss_fma(auVar70,auVar51,ZEXT416((uint)fVar4));
    fVar65 = auVar50._0_4_;
    fVar68 = auVar48._0_4_;
    iVar17 = (int)((double)((ulong)(0.0 <= fVar62) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar62) * -0x4020000000000000) + (double)fVar62);
    lVar42 = 0;
    iVar22 = (int)((double)((ulong)(0.0 <= fVar65) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar65) * -0x4020000000000000) + (double)fVar65);
    iVar16 = (int)((double)((ulong)(0.0 <= fVar68) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar68) * -0x4020000000000000) + (double)fVar68);
    pfVar32 = haarResponseX;
    pfVar47 = haarResponseY;
    do {
      auVar64._0_4_ = (float)iVar44;
      auVar64._4_12_ = in_ZMM8._4_12_;
      auVar48 = vfmadd213ss_fma(auVar64,auVar82._0_16_,ZEXT416((uint)fVar81));
      fVar62 = auVar48._0_4_;
      pfVar31 = (float *)((long)pfVar32 + lVar42 + local_c8);
      pfVar33 = (float *)((long)pfVar47 + lVar42 + local_c8);
      iVar24 = (int)((double)((ulong)(0.0 <= fVar62) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar62) * -0x4020000000000000) + (double)fVar62);
      if (((iVar17 < 1) || (iVar24 < 1)) || (iimage->height < iVar1 + iVar17)) {
LAB_001d84b3:
        haarXY(iimage,iVar17,iVar24,scale,pfVar31,pfVar33);
        iVar37 = iimage->width;
        pfVar32 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar37 = iimage->width;
        iVar27 = iVar1 + iVar24;
        if (iVar37 < iVar27) goto LAB_001d84b3;
        iVar28 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar40 = iVar24 + -1 + scale;
        iVar41 = iVar28 * (iVar17 + -1);
        iVar46 = iVar28 * (iVar17 + -1 + scale);
        iVar28 = iVar28 * (iVar1 + -1 + iVar17);
        fVar62 = pfVar2[iVar28 + -1 + iVar24];
        fVar65 = pfVar2[iVar41 + -1 + iVar27];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar41 + iVar40] - pfVar2[iVar28 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar28 + -1 + iVar27] -
                                                pfVar2[iVar41 + -1 + iVar24])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 + -1 + iVar24] -
                                                pfVar2[iVar46 + -1 + iVar27])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar28 + -1 + iVar27] -
                                                pfVar2[iVar41 + -1 + iVar24])));
        *pfVar31 = (fVar62 - fVar65) + auVar48._0_4_;
        *pfVar33 = auVar50._0_4_ - (fVar62 - fVar65);
      }
      pfVar31 = (float *)((long)pfVar32 + lVar42 + 0x60 + local_c8);
      pfVar33 = (float *)((long)pfVar47 + lVar42 + 0x60 + local_c8);
      if (((iVar22 < 1) || (iVar24 < 1)) ||
         ((iimage->height < iVar1 + iVar22 || (iVar27 = iVar1 + iVar24, iVar37 < iVar27)))) {
        haarXY(iimage,iVar22,iVar24,scale,pfVar31,pfVar33);
        iVar37 = iimage->width;
        pfVar32 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar40 = iVar24 + -1 + scale;
        iVar28 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar46 = iVar28 * (iVar22 + -1);
        iVar41 = iVar28 * (iVar22 + -1 + scale);
        iVar28 = iVar28 * (iVar1 + -1 + iVar22);
        fVar62 = pfVar2[iVar28 + -1 + iVar24];
        fVar65 = pfVar2[iVar46 + -1 + iVar27];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 + iVar40] - pfVar2[iVar28 + iVar40]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar28 + -1 + iVar27] -
                                                pfVar2[iVar46 + -1 + iVar24])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar41 + -1 + iVar24] -
                                                pfVar2[iVar41 + -1 + iVar27])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar28 + -1 + iVar27] -
                                                pfVar2[iVar46 + -1 + iVar24])));
        *pfVar31 = (fVar62 - fVar65) + auVar48._0_4_;
        *pfVar33 = auVar50._0_4_ - (fVar62 - fVar65);
      }
      lVar34 = local_c8 + lVar42 + 0xc0;
      pfVar31 = (float *)((long)pfVar32 + lVar34);
      pfVar33 = (float *)(lVar34 + (long)pfVar47);
      if (((iVar16 < 1) || (iVar24 < 1)) ||
         ((iimage->height < iVar1 + iVar16 || (iVar27 = iVar1 + iVar24, iVar37 < iVar27)))) {
        haarXY(iimage,iVar16,iVar24,scale,pfVar31,pfVar33);
        pfVar32 = haarResponseX;
        pfVar47 = haarResponseY;
      }
      else {
        iVar37 = iimage->data_width;
        pfVar2 = iimage->data;
        iVar28 = iVar24 + -1 + scale;
        iVar41 = iVar37 * (iVar16 + -1);
        iVar46 = iVar37 * (iVar16 + -1 + scale);
        iVar37 = iVar37 * (iVar1 + -1 + iVar16);
        fVar62 = pfVar2[iVar37 + -1 + iVar24];
        fVar65 = pfVar2[iVar41 + -1 + iVar27];
        auVar48 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar41 + iVar28] - pfVar2[iVar37 + iVar28]))
                                  ,SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar37 + -1 + iVar27] -
                                                pfVar2[iVar41 + -1 + iVar24])));
        auVar50 = vfmadd213ss_fma(ZEXT416((uint)(pfVar2[iVar46 + -1 + iVar24] -
                                                pfVar2[iVar46 + -1 + iVar27])),
                                  SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(pfVar2[iVar37 + -1 + iVar27] -
                                                pfVar2[iVar41 + -1 + iVar24])));
        *pfVar31 = (fVar62 - fVar65) + auVar48._0_4_;
        *pfVar33 = auVar50._0_4_ - (fVar62 - fVar65);
      }
      auVar82 = ZEXT1664(auVar49);
      iVar44 = iVar44 + 1;
      lVar42 = lVar42 + 4;
    } while (lVar42 != 0x60);
    local_c8 = local_c8 + 0x120;
    bVar3 = iVar21 < 9;
    iVar21 = iVar21 + 3;
  } while (bVar3);
LAB_001d883c:
  fVar81 = auVar82._0_4_;
  auVar80._8_4_ = 0x3effffff;
  auVar80._0_8_ = 0x3effffff3effffff;
  auVar80._12_4_ = 0x3effffff;
  auVar79._8_4_ = 0x80000000;
  auVar79._0_8_ = 0x8000000080000000;
  auVar79._12_4_ = 0x80000000;
  auVar48 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 0.5)),auVar79,0xf8);
  auVar48 = ZEXT416((uint)(fVar81 * 0.5 + auVar48._0_4_));
  auVar48 = vroundss_avx(auVar48,auVar48,0xb);
  auVar49 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 1.5)),auVar79,0xf8);
  auVar49 = ZEXT416((uint)(fVar81 * 1.5 + auVar49._0_4_));
  auVar49 = vroundss_avx(auVar49,auVar49,0xb);
  auVar50 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 2.5)),auVar79,0xf8);
  auVar50 = ZEXT416((uint)(fVar81 * 2.5 + auVar50._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  auVar51 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 3.5)),auVar79,0xf8);
  auVar51 = ZEXT416((uint)(fVar81 * 3.5 + auVar51._0_4_));
  auVar51 = vroundss_avx(auVar51,auVar51,0xb);
  auVar52 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 4.5)),auVar79,0xf8);
  auVar52 = ZEXT416((uint)(fVar81 * 4.5 + auVar52._0_4_));
  auVar52 = vroundss_avx(auVar52,auVar52,0xb);
  auVar53 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 5.5)),auVar79,0xf8);
  auVar53 = ZEXT416((uint)(fVar81 * 5.5 + auVar53._0_4_));
  auVar53 = vroundss_avx(auVar53,auVar53,0xb);
  auVar54 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 6.5)),auVar79,0xf8);
  auVar54 = ZEXT416((uint)(fVar81 * 6.5 + auVar54._0_4_));
  auVar54 = vroundss_avx(auVar54,auVar54,0xb);
  auVar55 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 7.5)),auVar79,0xf8);
  auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar81 * 7.5));
  auVar55 = vroundss_avx(auVar55,auVar55,0xb);
  auVar56 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 8.5)),auVar79,0xf8);
  auVar56 = ZEXT416((uint)(fVar81 * 8.5 + auVar56._0_4_));
  auVar56 = vroundss_avx(auVar56,auVar56,0xb);
  auVar57 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 9.5)),auVar79,0xf8);
  auVar57 = ZEXT416((uint)(fVar81 * 9.5 + auVar57._0_4_));
  auVar57 = vroundss_avx(auVar57,auVar57,0xb);
  auVar58 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 10.5)),auVar79,0xf8);
  auVar58 = ZEXT416((uint)(fVar81 * 10.5 + auVar58._0_4_));
  auVar58 = vroundss_avx(auVar58,auVar58,0xb);
  auVar59 = vpternlogd_avx512vl(auVar80,ZEXT416((uint)(fVar81 * 11.5)),auVar79,0xf8);
  fVar69 = auVar50._0_4_;
  fVar62 = fVar69 + auVar49._0_4_;
  fVar4 = fVar69 + auVar48._0_4_;
  auVar50 = ZEXT416((uint)(fVar81 * 11.5 + auVar59._0_4_));
  auVar50 = vroundss_avx(auVar50,auVar50,0xb);
  fVar81 = fVar69 - auVar48._0_4_;
  fVar65 = fVar69 - auVar49._0_4_;
  fVar68 = fVar69 - auVar51._0_4_;
  fVar5 = fVar69 - auVar52._0_4_;
  fVar6 = fVar69 - auVar53._0_4_;
  fVar69 = fVar69 - auVar54._0_4_;
  fVar77 = auVar55._0_4_;
  fVar7 = fVar77 - auVar51._0_4_;
  fVar8 = fVar77 - auVar52._0_4_;
  fVar9 = fVar77 - auVar53._0_4_;
  fVar10 = fVar77 - auVar54._0_4_;
  fVar11 = fVar77 - auVar56._0_4_;
  fVar12 = fVar77 - auVar57._0_4_;
  fVar13 = fVar77 - auVar58._0_4_;
  fVar77 = fVar77 - auVar50._0_4_;
  gauss_s1_c0[0] = expf(fVar62 * fVar62 * fVar61);
  gauss_s1_c0[1] = expf(fVar4 * fVar4 * fVar61);
  gauss_s1_c0[2] = expf(fVar81 * fVar81 * fVar61);
  gauss_s1_c0[3] = expf(fVar65 * fVar65 * fVar61);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar68 * fVar68 * fVar61);
  gauss_s1_c0[6] = expf(fVar5 * fVar5 * fVar61);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar61);
  gauss_s1_c0[8] = expf(fVar69 * fVar69 * fVar61);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar61);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar61);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar61);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar61);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar61);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar61);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar61);
  gauss_s1_c1[8] = expf(fVar77 * fVar77 * fVar61);
  auVar67._8_4_ = 0x7fffffff;
  auVar67._0_8_ = 0x7fffffff7fffffff;
  auVar67._12_4_ = 0x7fffffff;
  uVar19 = 0xfffffff8;
  fVar62 = 0.0;
  lVar42 = 0;
  lVar34 = 0;
  local_d0 = 0;
  do {
    pfVar32 = gauss_s1_c1;
    uVar18 = (uint)uVar19;
    if (uVar18 != 7) {
      pfVar32 = gauss_s1_c0;
    }
    lVar43 = (long)local_d0;
    lVar34 = (long)(int)lVar34;
    if (uVar18 == 0xfffffff8) {
      pfVar32 = gauss_s1_c1;
    }
    uVar39 = 0;
    local_d0 = local_d0 + 4;
    uVar29 = 0xfffffff8;
    lVar35 = (long)haarResponseX + lVar42;
    lVar25 = (long)haarResponseY + lVar42;
    do {
      pfVar47 = gauss_s1_c1;
      if (uVar29 != 7) {
        pfVar47 = gauss_s1_c0;
      }
      auVar82 = ZEXT1664(ZEXT816(0) << 0x40);
      if (uVar29 == 0xfffffff8) {
        pfVar47 = gauss_s1_c1;
      }
      uVar20 = (ulong)(uVar29 >> 0x1c & 0xfffffff8);
      uVar23 = uVar39;
      lVar26 = lVar25;
      lVar45 = lVar35;
      do {
        lVar36 = 0;
        pfVar31 = (float *)((long)pfVar32 + (ulong)(uint)((int)(uVar19 >> 0x1f) << 5));
        do {
          fVar4 = pfVar47[uVar20] * *pfVar31;
          pfVar31 = pfVar31 + (ulong)(~uVar18 >> 0x1f) * 2 + -1;
          auVar48 = vinsertps_avx(ZEXT416(*(uint *)(lVar26 + lVar36 * 4)),
                                  ZEXT416(*(uint *)(lVar45 + lVar36 * 4)),0x10);
          lVar36 = lVar36 + 1;
          auVar74._0_4_ = fVar4 * auVar48._0_4_;
          auVar74._4_4_ = fVar4 * auVar48._4_4_;
          auVar74._8_4_ = fVar4 * auVar48._8_4_;
          auVar74._12_4_ = fVar4 * auVar48._12_4_;
          auVar48 = vandps_avx(auVar74,auVar67);
          auVar48 = vmovlhps_avx(auVar74,auVar48);
          auVar71._0_4_ = auVar82._0_4_ + auVar48._0_4_;
          auVar71._4_4_ = auVar82._4_4_ + auVar48._4_4_;
          auVar71._8_4_ = auVar82._8_4_ + auVar48._8_4_;
          auVar71._12_4_ = auVar82._12_4_ + auVar48._12_4_;
          auVar82 = ZEXT1664(auVar71);
        } while (lVar36 != 9);
        uVar23 = uVar23 + 0x18;
        uVar20 = uVar20 + (ulong)(-1 < (int)uVar29) * 2 + -1;
        lVar45 = lVar45 + 0x60;
        lVar26 = lVar26 + 0x60;
      } while (uVar23 < uVar29 * 0x18 + 0x198);
      uVar29 = uVar29 + 5;
      uVar39 = uVar39 + 0x78;
      fVar4 = gauss_s2_arr[lVar43];
      auVar15._4_4_ = fVar4;
      auVar15._0_4_ = fVar4;
      auVar15._8_4_ = fVar4;
      auVar15._12_4_ = fVar4;
      auVar51 = vmulps_avx512vl(auVar71,auVar15);
      lVar43 = lVar43 + 1;
      auVar72._0_4_ = auVar51._0_4_ * auVar51._0_4_;
      auVar72._4_4_ = auVar51._4_4_ * auVar51._4_4_;
      auVar72._8_4_ = auVar51._8_4_ * auVar51._8_4_;
      auVar72._12_4_ = auVar51._12_4_ * auVar51._12_4_;
      auVar49 = vshufpd_avx(auVar51,auVar51,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar34) = auVar51;
      lVar34 = lVar34 + 4;
      lVar35 = lVar35 + 0x1e0;
      lVar25 = lVar25 + 0x1e0;
      auVar48 = vmovshdup_avx(auVar72);
      auVar50 = vfmadd231ss_fma(auVar48,auVar51,auVar51);
      auVar48 = vshufps_avx(auVar51,auVar51,0xff);
      auVar49 = vfmadd213ss_fma(auVar49,auVar49,auVar50);
      auVar48 = vfmadd213ss_fma(auVar48,auVar48,auVar49);
      fVar62 = fVar62 + auVar48._0_4_;
    } while (local_d0 != (int)lVar43);
    lVar42 = lVar42 + 0x14;
    uVar19 = (ulong)(uVar18 + 5);
  } while ((int)uVar18 < 3);
  if (fVar62 < 0.0) {
    fVar62 = sqrtf(fVar62);
  }
  else {
    auVar48 = vsqrtss_avx(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
    fVar62 = auVar48._0_4_;
  }
  lVar42 = 0;
  auVar82 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar62)));
  do {
    auVar60 = vmulps_avx512f(auVar82,*(undefined1 (*) [64])(ipoint->descriptor + lVar42));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar42) = auVar60;
    lVar42 = lVar42 + 0x10;
  } while (lVar42 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_3_1_False(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=3, l_count+=3) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=3, l_count+=3) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);

            for (int k=-12, k_count=0; k<12; k+=1, k_count+=1) {
                int k0 = k + 0;
                int k_count0 = k_count + 0;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}